

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_CharCodec.cpp
# Opt level: O0

size_t __thiscall
axl::enc::CharCodec::decode_utf16
          (CharCodec *this,String_utf16 *string,void *p0,size_t size,utf32_t replacement)

{
  size_t sVar1;
  long in_RCX;
  ulong in_RDX;
  long extraout_RDX;
  StringRefBase<short,_axl::sl::StringDetailsBase<short>_> *in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  size_t length;
  ConvertLengthResult result;
  utf16_t buffer [256];
  char *end;
  char *p;
  DecoderState state;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffd8c;
  StringBase<short,_axl::sl::StringDetailsBase<short>_> *in_stack_fffffffffffffd90;
  undefined1 local_248 [520];
  ulong local_40;
  ulong local_38;
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  ulong local_20;
  StringRefBase<short,_axl::sl::StringDetailsBase<short>_> *local_18;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::clear(in_stack_fffffffffffffd90);
  local_30 = 0;
  local_38 = local_20;
  local_40 = local_20 + local_28;
  while ((local_38 < local_40 &&
         (uVar2 = local_2c,
         (**(code **)(*in_RDI + 0x90))
                   (in_RDI,&local_30,local_248,0x100,local_38,local_40 - local_38),
         extraout_RDX != 0))) {
    sVar1 = sl::StringBase<short,_axl::sl::StringDetailsBase<short>_>::append
                      (in_stack_fffffffffffffd90,(C *)CONCAT44(in_stack_fffffffffffffd8c,uVar2),
                       0x188214);
    if (sVar1 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    local_38 = extraout_RDX + local_38;
  }
  sVar1 = sl::StringRefBase<short,_axl::sl::StringDetailsBase<short>_>::getLength(local_18);
  return sVar1;
}

Assistant:

size_t
CharCodec::decode_utf16(
	sl::String_utf16* string,
	const void* p0,
	size_t size,
	utf32_t replacement
) {
	string->clear();

	DecoderState state = 0;
	const char* p = (const char*)p0;
	const char* end = p + size;
	while (p < end) {
		utf16_t buffer[DecodeBufferLength];
		ConvertLengthResult result = decode_utf16(
			&state,
			buffer,
			countof(buffer),
			p,
			end - p,
			replacement
		);

		if (!result.m_srcLength)
			break;

		size_t length = string->append(buffer, result.m_dstLength);
		if (length == -1)
			return -1;

		p += result.m_srcLength;
	}

	return string->getLength();
}